

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>
           *this)

{
  NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>
  *this_local;
  
  NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>::NoFieldPresenceMapSerializeTest
            (&this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>);
  (this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).super_Test._vptr_Test =
       (_func_int **)
       &PTR__NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test_029df730;
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroString) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_bytes())[0] = "";

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_bytes(),
              UnorderedPointwise(Eq(), msg.map_int32_bytes()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ("", rt_msg.map_int32_bytes().at(0));
}